

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::mouseReleaseEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
  if ((this_00->buttonState & 2) != 0) {
    QAbstractSpinBoxPrivate::reset(this_00);
  }
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void QAbstractSpinBox::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    if ((d->buttonState & Mouse) != 0)
        d->reset();
    event->accept();
}